

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

void __thiscall
icu_63::TimeZoneFormat::initGMTOffsetPatterns(TimeZoneFormat *this,UErrorCode *status)

{
  UVector *pUVar1;
  int local_1c;
  int32_t type;
  UErrorCode *status_local;
  TimeZoneFormat *this_local;
  
  local_1c = 0;
  do {
    if (5 < local_1c) {
      checkAbuttingHoursAndMinutes(this);
      return;
    }
    if (local_1c == 0) {
LAB_0022ac12:
      pUVar1 = parseOffsetPattern((UnicodeString *)
                                  (this->fTargetRegion + (long)local_1c * 0x40 + 0x58),FIELDS_HM,
                                  status);
      this->fGMTOffsetPatternItems[local_1c] = pUVar1;
    }
    else if (local_1c == 1) {
LAB_0022ac4b:
      pUVar1 = parseOffsetPattern((UnicodeString *)
                                  (this->fTargetRegion + (long)local_1c * 0x40 + 0x58),FIELDS_HMS,
                                  status);
      this->fGMTOffsetPatternItems[local_1c] = pUVar1;
    }
    else {
      if (local_1c == 2) goto LAB_0022ac12;
      if (local_1c == 3) goto LAB_0022ac4b;
      if (local_1c == 4 || local_1c == 5) {
        pUVar1 = parseOffsetPattern((UnicodeString *)
                                    (this->fTargetRegion + (long)local_1c * 0x40 + 0x58),FIELDS_H,
                                    status);
        this->fGMTOffsetPatternItems[local_1c] = pUVar1;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void
TimeZoneFormat::initGMTOffsetPatterns(UErrorCode& status) {
    for (int32_t type = 0; type < UTZFMT_PAT_COUNT; type++) {
        switch (type) {
        case UTZFMT_PAT_POSITIVE_H:
        case UTZFMT_PAT_NEGATIVE_H:
            fGMTOffsetPatternItems[type] = parseOffsetPattern(fGMTOffsetPatterns[type], FIELDS_H, status);
            break;
        case UTZFMT_PAT_POSITIVE_HM:
        case UTZFMT_PAT_NEGATIVE_HM:
            fGMTOffsetPatternItems[type] = parseOffsetPattern(fGMTOffsetPatterns[type], FIELDS_HM, status);
            break;
        case UTZFMT_PAT_POSITIVE_HMS:
        case UTZFMT_PAT_NEGATIVE_HMS:
            fGMTOffsetPatternItems[type] = parseOffsetPattern(fGMTOffsetPatterns[type], FIELDS_HMS, status);
            break;
        }
    }
    checkAbuttingHoursAndMinutes();
}